

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

string * __thiscall
websocketpp::http::parser::parser::raw_headers_abi_cxx11_
          (string *__return_storage_ptr__,parser *this)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  _Self __tmp;
  stringstream raw;
  stringstream asStack_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  for (p_Var2 = (this->m_headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_headers)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::operator<<(local_1a8,(string *)(p_Var2 + 1));
    poVar1 = std::operator<<(poVar1,": ");
    poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 2));
    std::operator<<(poVar1,"\r\n");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  return __return_storage_ptr__;
}

Assistant:

inline std::string parser::raw_headers() const {
    std::stringstream raw;

    header_list::const_iterator it;
    for (it = m_headers.begin(); it != m_headers.end(); it++) {
        raw << it->first << ": " << it->second << "\r\n";
    }

    return raw.str();
}